

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getweakrefval(HSQUIRRELVM v,SQInteger idx)

{
  SQVM *in_RDI;
  SQObjectPtr *o;
  SQObjectPtr *in_stack_ffffffffffffffa8;
  HSQUIRRELVM in_stack_ffffffffffffffb0;
  SQObjectPtr local_30;
  SQObjectPtr *local_20;
  SQVM *local_10;
  SQRESULT local_8;
  
  local_10 = in_RDI;
  local_20 = stack_get(in_stack_ffffffffffffffb0,(SQInteger)in_stack_ffffffffffffffa8);
  if ((local_20->super_SQObject)._type == OT_WEAKREF) {
    SQObjectPtr::SQObjectPtr(&local_30,&((local_20->super_SQObject)._unVal.pWeakRef)->_obj);
    SQVM::Push(local_10,in_stack_ffffffffffffffa8);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_10);
    local_8 = 0;
  }
  else {
    local_8 = sq_throwerror(in_stack_ffffffffffffffb0,(SQChar *)in_stack_ffffffffffffffa8);
  }
  return local_8;
}

Assistant:

SQRESULT sq_getweakrefval(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &o = stack_get(v,idx);
    if(type(o) != OT_WEAKREF) {
        return sq_throwerror(v,_SC("the object must be a weakref"));
    }
    v->Push(_weakref(o)->_obj);
    return SQ_OK;
}